

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# That.hpp
# Opt level: O2

void ut11::Assert::That<char[16],ut11::Operands::IsStringBeginningWith>
               (size_t line,string *file,char (*expected) [16],IsStringBeginningWith *operand)

{
  bool bVar1;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_88,*expected,&local_89);
  bVar1 = Operands::IsStringBeginningWith::operator()(operand,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_48,(string *)file);
    std::__cxx11::string::string((string *)&local_88,*expected,&local_89);
    Operands::IsStringBeginningWith::GetErrorMessage(&local_68,operand,&local_88);
    Fail(line,&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

inline void That(std::size_t line, std::string file, const Expected& expected, const Operand& operand)
		{
			if ( operand(expected) )
				return;
			Fail(line, file, operand.GetErrorMessage(expected));
		}